

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

void al_destroy_shader(ALLEGRO_SHADER *shader)

{
  _Bool _Var1;
  ALLEGRO_BITMAP *pAVar2;
  ulong uVar3;
  size_t sVar4;
  long *plVar5;
  undefined8 *in_RDI;
  char *in_stack_00000008;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_BITMAP **slot;
  uint i;
  ALLEGRO_BITMAP *bmp;
  _AL_LIST_ITEM *in_stack_ffffffffffffffc8;
  _AL_DTOR_LIST *in_stack_ffffffffffffffd0;
  ALLEGRO_SHADER *in_stack_ffffffffffffffd8;
  uint local_14;
  
  if (in_RDI != (undefined8 *)0x0) {
    pAVar2 = al_get_target_bitmap();
    if ((pAVar2 != (ALLEGRO_BITMAP *)0x0) &&
       (_Var1 = _al_vector_contains((_AL_VECTOR *)in_stack_ffffffffffffffd0,
                                    in_stack_ffffffffffffffc8), _Var1)) {
      _Var1 = _al_trace_prefix((char *)bmp,i,(char *)slot,bitmap._4_4_,in_stack_00000008);
      if (_Var1) {
        _al_trace_suffix("implicitly unusing shader on target bitmap\n");
      }
      al_use_shader(in_stack_ffffffffffffffd8);
    }
    _al_unregister_destructor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    al_ustr_free((ALLEGRO_USTR *)0x17d834);
    *in_RDI = 0;
    al_ustr_free((ALLEGRO_USTR *)0x17d84e);
    in_RDI[1] = 0;
    al_ustr_free((ALLEGRO_USTR *)0x17d869);
    in_RDI[2] = 0;
    local_14 = 0;
    while( true ) {
      uVar3 = (ulong)local_14;
      sVar4 = _al_vector_size((_AL_VECTOR *)(in_RDI + 5));
      if (sVar4 <= uVar3) break;
      plVar5 = (long *)_al_vector_ref((_AL_VECTOR *)(in_RDI + 5),local_14);
      *(undefined8 *)(*plVar5 + 0x170) = 0;
      local_14 = local_14 + 1;
    }
    _al_vector_free((_AL_VECTOR *)0x17d8f1);
    (**(code **)(in_RDI[4] + 0x20))(in_RDI);
  }
  return;
}

Assistant:

void al_destroy_shader(ALLEGRO_SHADER *shader)
{
   ALLEGRO_BITMAP *bmp;
   unsigned i;

   if (!shader)
      return;

   /* As a convenience, implicitly unuse the shader on the target bitmap
    * if currently used.
    */
   bmp = al_get_target_bitmap();
   if (bmp && _al_vector_contains(&shader->bitmaps, &bmp)) {
      ALLEGRO_DEBUG("implicitly unusing shader on target bitmap\n");
      al_use_shader(NULL);
   }

   _al_unregister_destructor(_al_dtor_list, shader->dtor_item);

   al_ustr_free(shader->vertex_copy);
   shader->vertex_copy = NULL;
   al_ustr_free(shader->pixel_copy);
   shader->pixel_copy = NULL;
   al_ustr_free(shader->log);
   shader->log = NULL;

   /* Clear references to this shader from all bitmaps. */
   for (i = 0; i < _al_vector_size(&shader->bitmaps); i++) {
      ALLEGRO_BITMAP **slot = _al_vector_ref(&shader->bitmaps, i);
      ALLEGRO_BITMAP *bitmap = *slot;
      ASSERT(bitmap->shader == shader);
      bitmap->shader = NULL;
   }
   _al_vector_free(&shader->bitmaps);

   shader->vt->destroy_shader(shader);
}